

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O1

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithIdentity_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithIdentity_Test *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertionResult gtest_ar;
  ColMatrix m;
  ColMatrix idnt;
  long alStack_158 [3];
  undefined1 local_140 [48];
  SVector local_110;
  Nonzero local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Nonzero local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ColMatrix local_98;
  ColMatrix local_70;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  alStack_158[1] = 0x16027e;
  ColMatrix::identity(&local_70,3);
  local_d8 = 1;
  uStack_d0 = 0;
  local_e8 = 2;
  uStack_e0 = 0xc008000000000000;
  local_f8.index = 0;
  local_f8.value = 7.0;
  alStack_158[1] = 0x1602b5;
  l._M_len = 3;
  l._M_array = &local_f8;
  SVector::SVector((SVector *)local_140,l);
  local_a8 = 2;
  uStack_a0 = 0x4010000000000000;
  local_b8 = 1;
  uStack_b0 = 0x4008000000000000;
  local_c8.index = 0;
  local_c8.value = 2.0;
  alStack_158[1] = 0x1602ef;
  l_00._M_len = 3;
  l_00._M_array = &local_c8;
  SVector::SVector((SVector *)(local_140 + 0x18),l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  alStack_158[1] = 0x160329;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_110,l_01);
  alStack_158[1] = 0x16034b;
  colList._M_len = 3;
  colList._M_array = (iterator)local_140;
  ColMatrix::ColMatrix(&local_98,3,3,colList);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)alStack_158 + lVar3);
    if (pvVar1 != (void *)0x0) {
      alStack_158[1] = 0x160366;
      operator_delete(pvVar1,*(long *)((long)alStack_158 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  alStack_158[1] = 0x160386;
  ColMatrix::operator*((ColMatrix *)local_140,&local_70,&local_98);
  alStack_158[1] = 0x1603ab;
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&local_f8,"m","idnt * m",&local_98,(ColMatrix *)local_140);
  alStack_158[1] = 0x1603b5;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if ((char)local_f8.index == '\0') {
    alStack_158[1] = 0x1603ca;
    testing::Message::Message((Message *)local_140);
    if ((undefined8 *)local_f8.value == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_f8.value;
    }
    alStack_158[1] = 0x1603fe;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x69,pcVar4);
    alStack_158[1] = 0x160410;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    alStack_158[1] = 0x16041d;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      alStack_158[1] = 0x16042f;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((pointer)local_140._0_8_ != (pointer)0x0)) {
        alStack_158[1] = 0x160443;
        (**(code **)(*(long *)local_140._0_8_ + 8))();
      }
      local_140._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  alStack_158[1] = 0x160458;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  alStack_158[1] = 0x160472;
  ColMatrix::operator*((ColMatrix *)local_140,&local_98,&local_70);
  alStack_158[1] = 0x160497;
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&local_f8,"m","m * idnt",&local_98,(ColMatrix *)local_140);
  alStack_158[1] = 0x1604a1;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if ((char)local_f8.index == '\0') {
    alStack_158[1] = 0x1604b6;
    testing::Message::Message((Message *)local_140);
    if ((undefined8 *)local_f8.value == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_f8.value;
    }
    alStack_158[1] = 0x1604ea;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x6a,pcVar4);
    alStack_158[1] = 0x1604fc;
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    alStack_158[1] = 0x160509;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((pointer)local_140._0_8_ != (pointer)0x0) {
      alStack_158[1] = 0x16051b;
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        alStack_158[1] = 0x16052f;
        (**(code **)(*(long *)local_140._0_8_ + 8))();
      }
      local_140._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  alStack_158[1] = 0x160544;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_f8.value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  alStack_158[1] = 0x160551;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_98.cols);
  alStack_158[1] = 0x16055e;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&local_70.cols);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithIdentity) {
  const auto idnt = ColMatrix::identity(3);
  const ColMatrix m(3, 3,
                    {{{0, 7}, {2, -3}, {1, 0.0}},
                     {{0, 2}, {1, 3}, {2, 4}},
                     {{0, 1}, {1, -1}, {2, -2}}});
  EXPECT_EQ(m, idnt * m);
  EXPECT_EQ(m, m * idnt);
}